

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cIA,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  FSpecialColormap *pFVar5;
  EBlend EVar6;
  long lVar7;
  BYTE BVar8;
  int iVar9;
  int iVar10;
  BYTE *pBVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar6 = BLEND_NONE;
  }
  else {
    EVar6 = inf->blend;
  }
  switch(EVar6) {
  case BLEND_NONE:
    if (0 < count) {
      lVar7 = 0;
      do {
        bVar2 = pin[1];
        if (bVar2 != 0) {
          iVar10 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar7 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4 + 2] = (BYTE)iVar10;
          iVar10 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar7 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4 + 1] = (BYTE)iVar10;
          iVar10 = (int)((uint)*pin * inf->alpha + (uint)pout[lVar7 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4] = (BYTE)iVar10;
          pout[lVar7 * 4 + 3] = bVar2;
        }
        pin = pin + step;
        lVar7 = lVar7 + 1;
      } while (count != (int)lVar7);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pBVar11 = pin + 1;
      lVar7 = 0;
      do {
        BVar1 = *pBVar11;
        if (BVar1 != '\0') {
          bVar2 = pBVar11[-1] >> 4;
          iVar10 = (int)((uint)IcePalette[bVar2][0] * inf->alpha +
                        (uint)pout[lVar7 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4 + 2] = (BYTE)iVar10;
          iVar10 = (int)((uint)IcePalette[bVar2][1] * inf->alpha +
                        (uint)pout[lVar7 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4 + 1] = (BYTE)iVar10;
          iVar10 = (int)((uint)IcePalette[bVar2][2] * inf->alpha + (uint)pout[lVar7 * 4] * 0x10000)
                   >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4] = (BYTE)iVar10;
          pout[lVar7 * 4 + 3] = BVar1;
        }
        lVar7 = lVar7 + 1;
        pBVar11 = pBVar11 + step;
      } while (count != (int)lVar7);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pBVar11 = pin + 1;
      lVar7 = 0;
      do {
        BVar1 = *pBVar11;
        if (BVar1 != '\0') {
          iVar13 = (uint)pBVar11[-1] * inf->blendcolor[3];
          iVar10 = inf->blendcolor[1];
          iVar4 = inf->blendcolor[2];
          iVar9 = ((uint)(inf->blendcolor[0] + iVar13) >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar7 * 4 + 2] * 0x10000;
          BVar8 = (BYTE)((uint)iVar9 >> 0x10);
          if (0xfe < iVar9 >> 0x10) {
            BVar8 = 0xff;
          }
          pout[lVar7 * 4 + 2] = BVar8;
          iVar10 = ((uint)(iVar10 + iVar13) >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar7 * 4 + 1] * 0x10000;
          BVar8 = (BYTE)((uint)iVar10 >> 0x10);
          if (0xfe < iVar10 >> 0x10) {
            BVar8 = 0xff;
          }
          pout[lVar7 * 4 + 1] = BVar8;
          iVar10 = ((uint)(iVar13 + iVar4) >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar7 * 4] * 0x10000;
          BVar8 = (BYTE)((uint)iVar10 >> 0x10);
          if (0xfe < iVar10 >> 0x10) {
            BVar8 = 0xff;
          }
          pout[lVar7 * 4] = BVar8;
          pout[lVar7 * 4 + 3] = BVar1;
        }
        lVar7 = lVar7 + 1;
        pBVar11 = pBVar11 + step;
      } while (count != (int)lVar7);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pBVar11 = pin + 1;
      lVar7 = 0;
      do {
        BVar1 = *pBVar11;
        if (BVar1 != '\0') {
          bVar2 = pBVar11[-1];
          iVar10 = (int)((inf->blendcolor[0] * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar7 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          iVar4 = inf->blendcolor[1];
          iVar9 = inf->blendcolor[2];
          pout[lVar7 * 4 + 2] = (BYTE)iVar10;
          iVar10 = (int)((iVar4 * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar7 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4 + 1] = (BYTE)iVar10;
          iVar10 = (int)(((uint)bVar2 * iVar9 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar7 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar7 * 4] = (BYTE)iVar10;
          pout[lVar7 * 4 + 3] = BVar1;
        }
        lVar7 = lVar7 + 1;
        pBVar11 = pBVar11 + step;
      } while (count != (int)lVar7);
    }
    break;
  default:
    lVar7 = (long)inf->blend;
    if (lVar7 < 0x21) {
      if (0 < count && BLEND_ICEMAP < inf->blend) {
        pBVar11 = pin + 1;
        lVar7 = 0;
        do {
          BVar1 = *pBVar11;
          if (BVar1 != '\0') {
            bVar2 = pBVar11[-1];
            iVar10 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar7 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            pout[lVar7 * 4 + 2] = (BYTE)iVar10;
            iVar10 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar7 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            pout[lVar7 * 4 + 1] = (BYTE)iVar10;
            iVar10 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar7 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            pout[lVar7 * 4] = (BYTE)iVar10;
            pout[lVar7 * 4 + 3] = BVar1;
          }
          lVar7 = lVar7 + 1;
          pBVar11 = pBVar11 + step;
        } while (count != (int)lVar7);
      }
    }
    else if (0 < count) {
      pBVar11 = pin + 1;
      lVar12 = 0;
      do {
        BVar1 = *pBVar11;
        if (BVar1 != '\0') {
          uVar14 = (ulong)pBVar11[-1];
          iVar10 = (int)((uint)*(byte *)((long)pFVar5 + uVar14 * 4 + lVar7 * 0x518 + -0xa6fe) *
                         inf->alpha + (uint)pout[lVar12 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          bVar2 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar7 * 0x518 + -0xa700);
          bVar3 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar7 * 0x518 + -0xa6ff);
          pout[lVar12 * 4 + 2] = (BYTE)iVar10;
          iVar10 = (int)((uint)bVar3 * inf->alpha + (uint)pout[lVar12 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar12 * 4 + 1] = (BYTE)iVar10;
          iVar10 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar12 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          pout[lVar12 * 4] = (BYTE)iVar10;
          pout[lVar12 * 4 + 3] = BVar1;
        }
        lVar12 = lVar12 + 1;
        pBVar11 = pBVar11 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}